

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O2

DWORD __thiscall
FNodeBuilder::CheckLoopStart(FNodeBuilder *this,fixed_t dx,fixed_t dy,int vertex,int vertex2)

{
  FPrivVert *pFVar1;
  uint uVar2;
  FPrivVert *pFVar3;
  FPrivSeg *pFVar4;
  FPrivSeg *pFVar5;
  angle_t aVar6;
  angle_t aVar7;
  int iVar8;
  ulong uVar9;
  uint uVar11;
  uint uVar12;
  uint local_44;
  DWORD *pDVar10;
  
  pFVar3 = (this->Vertices).Array;
  pFVar1 = pFVar3 + vertex;
  aVar6 = PointToAngle(dx,dy);
  pDVar10 = &pFVar3[vertex].segs2;
  uVar11 = 0xffffffff;
  local_44 = 0xffffffff;
  while( true ) {
    uVar2 = *pDVar10;
    uVar9 = (ulong)uVar2;
    if (uVar9 == 0xffffffff) break;
    pFVar4 = (this->Segs).Array;
    pFVar3 = (this->Vertices).Array;
    pFVar5 = pFVar4 + uVar9;
    iVar8 = pFVar4[uVar9].v1;
    aVar7 = PointToAngle(pFVar3[iVar8].super_FSimpleVert.x - (pFVar1->super_FSimpleVert).x,
                         pFVar3[iVar8].super_FSimpleVert.y - (pFVar1->super_FSimpleVert).y);
    uVar12 = aVar6 - aVar7;
    if (((4999 < uVar12) ||
        (iVar8 = pFVar5->v1, pFVar3 = (this->Vertices).Array,
        iVar8 = PointOnSide(pFVar3[iVar8].super_FSimpleVert.x,pFVar3[iVar8].super_FSimpleVert.y,
                            (pFVar1->super_FSimpleVert).x,(pFVar1->super_FSimpleVert).y,dx,dy),
        iVar8 != 0)) && (uVar12 <= uVar11)) {
      local_44 = uVar2;
      uVar11 = uVar12;
    }
    pDVar10 = &pFVar5->nextforvert2;
  }
  if (local_44 != 0xffffffff) {
    pDVar10 = &pFVar1->segs;
    do {
      uVar9 = (ulong)*pDVar10;
      if (uVar9 == 0xffffffff) {
        return local_44;
      }
      pFVar5 = (this->Segs).Array;
      iVar8 = pFVar5[uVar9].v2;
      if (iVar8 == vertex2) {
        return 0xffffffff;
      }
      pFVar3 = (this->Vertices).Array;
      aVar7 = PointToAngle(pFVar3[iVar8].super_FSimpleVert.x - (pFVar1->super_FSimpleVert).x,
                           pFVar3[iVar8].super_FSimpleVert.y - (pFVar1->super_FSimpleVert).y);
      pDVar10 = &pFVar5[uVar9].nextforvert;
    } while ((uVar11 <= aVar6 - aVar7) || (pFVar5[uVar9].partner == local_44));
  }
  return 0xffffffff;
}

Assistant:

DWORD FNodeBuilder::CheckLoopStart (fixed_t dx, fixed_t dy, int vertex, int vertex2)
{
	FPrivVert *v = &Vertices[vertex];
	angle_t splitAngle = PointToAngle (dx, dy);
	DWORD segnum;
	angle_t bestang;
	DWORD bestseg;

	// Find the seg ending at this vertex that forms the smallest angle
	// to the splitter.
	segnum = v->segs2;
	bestang = ANGLE_MAX;
	bestseg = DWORD_MAX;
	while (segnum != DWORD_MAX)
	{
		FPrivSeg *seg = &Segs[segnum];
		angle_t segAngle = PointToAngle (Vertices[seg->v1].x - v->x, Vertices[seg->v1].y - v->y);
		angle_t diff = splitAngle - segAngle;

		if (diff < ANGLE_EPSILON &&
			PointOnSide (Vertices[seg->v1].x, Vertices[seg->v1].y, v->x, v->y, dx, dy) == 0)
		{
			// If a seg lies right on the splitter, don't count it
		}
		else
		{
			if (diff <= bestang)
			{
				bestang = diff;
				bestseg = segnum;
			}
		}
		segnum = seg->nextforvert2;
	}
	if (bestseg == DWORD_MAX)
	{
		return DWORD_MAX;
	}
	// Now make sure there are no segs starting at this vertex that form
	// an even smaller angle to the splitter.
	segnum = v->segs;
	while (segnum != DWORD_MAX)
	{
		FPrivSeg *seg = &Segs[segnum];
		if (seg->v2 == vertex2)
		{
			return DWORD_MAX;
		}
		angle_t segAngle = PointToAngle (Vertices[seg->v2].x - v->x, Vertices[seg->v2].y - v->y);
		angle_t diff = splitAngle - segAngle;
		if (diff < bestang && seg->partner != bestseg)
		{
			return DWORD_MAX;
		}
		segnum = seg->nextforvert;
	}
	return bestseg;
}